

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_Interfaces(RTPUDPv6Transmitter *this)

{
  bool bVar1;
  sockaddr_in6 *inaddr;
  ifaddrs *tmp;
  ifaddrs *addrs;
  RTPUDPv6Transmitter *this_local;
  
  addrs = (ifaddrs *)this;
  getifaddrs(&tmp);
  for (inaddr = (sockaddr_in6 *)tmp; inaddr != (sockaddr_in6 *)0x0;
      inaddr = *(sockaddr_in6 **)inaddr) {
    if ((*(long *)&inaddr->sin6_scope_id != 0) && (**(short **)&inaddr->sin6_scope_id == 10)) {
      std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
                (&this->localIPs,(value_type *)(*(long *)&inaddr->sin6_scope_id + 8));
    }
  }
  freeifaddrs(tmp);
  bVar1 = std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::empty(&this->localIPs);
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv6Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET6)
		{
			struct sockaddr_in6 *inaddr = (struct sockaddr_in6 *)tmp->ifa_addr;
			localIPs.push_back(inaddr->sin6_addr);
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}